

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int do_buf(uchar *buf,int buflen,int encoding,unsigned_long flags,char *quotes,BIO *out)

{
  int reason;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  int unaff_EBP;
  size_t sVar6;
  bool bVar7;
  uint32_t c;
  uint8_t utf8_buf [6];
  CBS cbs;
  CBB utf8_cbb;
  uint32_t local_c4;
  byte local_96 [6];
  uchar *local_90;
  long local_88;
  code *local_80;
  size_t local_78;
  long local_70;
  uchar *local_68;
  CBB local_60;
  
  uVar1 = encoding - 0x1000;
  if ((4 < uVar1) || ((0x17U >> (encoding & 0x1fU) & 1) == 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                  ,0x73,"int do_buf(const unsigned char *, int, int, unsigned long, char *, BIO *)")
    ;
  }
  reason = *(int *)(&DAT_002a79dc + (ulong)uVar1 * 4);
  local_80 = (code *)(&PTR_CBS_get_utf8_00306670)[uVar1];
  local_88 = (long)buflen;
  iVar5 = 0;
  local_90 = buf;
  do {
    if (local_88 == 0) {
      return iVar5;
    }
    local_68 = local_90;
    bVar7 = local_90 == buf;
    iVar2 = (*local_80)(&local_90);
    if (iVar2 == 0) {
      bVar7 = false;
      ERR_put_error(0xc,0,reason,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                    ,0x7e);
      unaff_EBP = -1;
    }
    else if ((flags & 0x10) == 0) {
      iVar3 = do_esc_char(local_c4,flags,quotes,out,(uint)bVar7,(uint)(local_88 == 0));
      bVar7 = false;
      iVar2 = 0;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      iVar5 = iVar5 + iVar2;
      if (iVar3 < 0) {
        unaff_EBP = -1;
      }
      else {
LAB_002266fd:
        bVar7 = true;
      }
    }
    else {
      local_70 = local_88;
      CBB_init_fixed(&local_60,local_96,6);
      iVar2 = CBB_add_utf8(&local_60,local_c4);
      if (iVar2 == 0) {
        bVar7 = false;
        ERR_put_error(0xc,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_strex.cc"
                      ,0x87);
        unaff_EBP = 1;
      }
      else {
        sVar4 = CBB_len(&local_60);
        bVar7 = sVar4 == 0;
        if (!bVar7) {
          local_78 = sVar4 - 1;
          sVar6 = 0;
          do {
            iVar3 = do_esc_char((uint)local_96[sVar6],flags,quotes,out,
                                (uint)(local_68 == buf && sVar6 == 0),
                                (uint)(local_78 == sVar6 && local_70 == 0));
            bVar7 = false;
            iVar2 = 0;
            if (-1 < iVar3) {
              iVar2 = iVar3;
            }
            iVar5 = iVar2 + iVar5;
            if (iVar3 < 0) {
              unaff_EBP = -1;
              goto LAB_002266f3;
            }
            sVar6 = sVar6 + 1;
          } while (sVar4 != sVar6);
          bVar7 = true;
        }
      }
LAB_002266f3:
      if (bVar7) goto LAB_002266fd;
      bVar7 = false;
    }
    if (!bVar7) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int do_buf(const unsigned char *buf, int buflen, int encoding,
                  unsigned long flags, char *quotes, BIO *out) {
  int (*get_char)(CBS *cbs, uint32_t *out);
  int get_char_error;
  switch (encoding) {
    case MBSTRING_UNIV:
      get_char = CBS_get_utf32_be;
      get_char_error = ASN1_R_INVALID_UNIVERSALSTRING;
      break;
    case MBSTRING_BMP:
      get_char = CBS_get_ucs2_be;
      get_char_error = ASN1_R_INVALID_BMPSTRING;
      break;
    case MBSTRING_ASC:
      get_char = CBS_get_latin1;
      get_char_error = ERR_R_INTERNAL_ERROR;  // Should not be possible.
      break;
    case MBSTRING_UTF8:
      get_char = CBS_get_utf8;
      get_char_error = ASN1_R_INVALID_UTF8STRING;
      break;
    default:
      assert(0);
      return -1;
  }

  CBS cbs;
  CBS_init(&cbs, buf, buflen);
  int outlen = 0;
  while (CBS_len(&cbs) != 0) {
    const int is_first = CBS_data(&cbs) == buf;
    uint32_t c;
    if (!get_char(&cbs, &c)) {
      OPENSSL_PUT_ERROR(ASN1, get_char_error);
      return -1;
    }
    const int is_last = CBS_len(&cbs) == 0;
    if (flags & ASN1_STRFLGS_UTF8_CONVERT) {
      uint8_t utf8_buf[6];
      CBB utf8_cbb;
      CBB_init_fixed(&utf8_cbb, utf8_buf, sizeof(utf8_buf));
      if (!CBB_add_utf8(&utf8_cbb, c)) {
        OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
        return 1;
      }
      size_t utf8_len = CBB_len(&utf8_cbb);
      for (size_t i = 0; i < utf8_len; i++) {
        int len = do_esc_char(utf8_buf[i], flags, quotes, out,
                              is_first && i == 0, is_last && i == utf8_len - 1);
        if (len < 0) {
          return -1;
        }
        outlen += len;
      }
    } else {
      int len = do_esc_char(c, flags, quotes, out, is_first, is_last);
      if (len < 0) {
        return -1;
      }
      outlen += len;
    }
  }
  return outlen;
}